

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnTableSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index table_index)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_pointer pcVar4;
  string_view sVar5;
  BinaryReaderObjdump *local_48;
  char *local_40;
  Index table_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdump *)name.data_;
  bVar1 = string_view::empty((string_view *)&this_local);
  if (bVar1) {
    sVar5 = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,table_index);
    local_48 = (BinaryReaderObjdump *)sVar5.data_;
    this_local = local_48;
    local_40 = (char *)sVar5.size_;
    name_local.data_ = local_40;
  }
  sVar3 = string_view::length((string_view *)&this_local);
  pcVar4 = string_view::data((string_view *)&this_local);
  PrintDetails(this,"   - %d: T <%.*s> table=%u",(ulong)index,sVar3 & 0xffffffff,pcVar4,
               (ulong)table_index);
  RVar2 = PrintSymbolFlags(this,flags);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnTableSymbol(Index index,
                                          uint32_t flags,
                                          string_view name,
                                          Index table_index) {
  if (name.empty()) {
    name = GetTableName(table_index);
  }
  PrintDetails("   - %d: T <" PRIstringview "> table=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), table_index);
  return PrintSymbolFlags(flags);
}